

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

uint64_t nng_stat_value(nng_stat *stat)

{
  return (stat->s_val).sv_value;
}

Assistant:

uint64_t
nng_stat_value(const nng_stat *stat)
{
#if NNG_ENABLE_STATS
	return (stat->s_val.sv_value);
#else
	NNI_ARG_UNUSED(stat);
	return (0);
#endif
}